

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

void __thiscall
kj::Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>::eraseImpl
          (Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *this,
          size_t pos)

{
  StringPtr *pSVar1;
  HashBucket *pHVar2;
  StringPtr *pSVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  RemoveConst<kj::StringPtr> *pRVar7;
  size_t in_RCX;
  size_t extraout_RDX;
  StringPtr *in_R8;
  size_t sVar8;
  ArrayPtr<kj::StringPtr> table;
  StringPtr str;
  char *local_38;
  size_t sStack_30;
  
  pSVar1 = (this->rows).builder.ptr + pos;
  local_38 = (pSVar1->content).ptr;
  sStack_30 = (pSVar1->content).size_;
  table.size_ = (size_t)&local_38;
  table.ptr = (StringPtr *)pos;
  HashIndex<kj::_::(anonymous_namespace)::StringHasher>::erase<kj::StringPtr,kj::StringPtr>
            (&this->indexes,table,in_RCX,in_R8);
  pSVar1 = (this->rows).builder.ptr;
  pRVar7 = (this->rows).builder.pos;
  sVar8 = ((long)pRVar7 - (long)pSVar1 >> 4) - 1;
  if (sVar8 != pos) {
    str.content.size_ = extraout_RDX;
    str.content.ptr = (char *)pSVar1[sVar8].content.size_;
    uVar4 = _::anon_unknown_0::StringHasher::hashCode((StringHasher *)pSVar1[sVar8].content.ptr,str)
    ;
    uVar5 = _::chooseBucket(uVar4,(uint)(this->indexes).buckets.size_);
    pHVar2 = (this->indexes).buckets.ptr;
    while( true ) {
      uVar6 = (ulong)uVar5;
      uVar4 = pHVar2[uVar6].value;
      if ((int)sVar8 + 2U == uVar4) break;
      if (uVar4 == 0) {
        _::logHashTableInconsistency();
        goto LAB_001521f3;
      }
      uVar5 = (uint)(uVar6 + 1);
      if (uVar6 + 1 == (this->indexes).buckets.size_) {
        uVar5 = 0;
      }
    }
    pHVar2[uVar6].value = (int)pos + 2;
LAB_001521f3:
    pSVar3 = (this->rows).builder.ptr;
    pSVar1 = pSVar3 + sVar8;
    sVar8 = (pSVar1->content).size_;
    pSVar3 = pSVar3 + pos;
    (pSVar3->content).ptr = (pSVar1->content).ptr;
    (pSVar3->content).size_ = sVar8;
    pRVar7 = (this->rows).builder.pos;
  }
  (this->rows).builder.pos = pRVar7 + -1;
  return;
}

Assistant:

void Table<Row, Indexes...>::eraseImpl(size_t pos) {
  Impl<>::erase(*this, pos, rows[pos]);
  size_t back = rows.size() - 1;
  if (pos != back) {
    Impl<>::move(*this, back, pos, rows[back]);
    rows[pos] = kj::mv(rows[back]);
  }
  rows.removeLast();
}